

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SWDAnalyzer.cpp
# Opt level: O1

void __thiscall SWDAnalyzer::WorkerThread(SWDAnalyzer *this)

{
  auto_ptr<SWDAnalyzerResults> *paVar1;
  SWDParser *this_00;
  pointer pSVar2;
  bool bVar3;
  AnalyzerChannelData *pAVar4;
  SWDLineReset reset;
  SWDOperation tran;
  SWDLineReset local_a8;
  SWDOperation local_88;
  SWDBit local_58;
  
  pAVar4 = (AnalyzerChannelData *)Analyzer::GetAnalyzerChannelData((Channel *)this);
  this->mSWDIO = pAVar4;
  pAVar4 = (AnalyzerChannelData *)Analyzer::GetAnalyzerChannelData((Channel *)this);
  this->mSWCLK = pAVar4;
  this_00 = &this->mSWDParser;
  SWDParser::Setup(this_00,this->mSWDIO,pAVar4,this);
  local_88.bits.super__Vector_base<SWDBit,_std::allocator<SWDBit>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_88.bits.super__Vector_base<SWDBit,_std::allocator<SWDBit>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_88.bits.super__Vector_base<SWDBit,_std::allocator<SWDBit>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_a8.bits.super__Vector_base<SWDBit,_std::allocator<SWDBit>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_a8.bits.super__Vector_base<SWDBit,_std::allocator<SWDBit>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_a8.bits.super__Vector_base<SWDBit,_std::allocator<SWDBit>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  pSVar2 = (this->mSWDParser).mBitsBuffer.super__Vector_base<SWDBit,_std::allocator<SWDBit>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((this->mSWDParser).mBitsBuffer.super__Vector_base<SWDBit,_std::allocator<SWDBit>_>._M_impl.
      super__Vector_impl_data._M_finish != pSVar2) {
    (this->mSWDParser).mBitsBuffer.super__Vector_base<SWDBit,_std::allocator<SWDBit>_>._M_impl.
    super__Vector_impl_data._M_finish = pSVar2;
  }
  (this->mSWDParser).mSelectRegister = 0;
  paVar1 = &this->mResults;
  do {
    bVar3 = SWDParser::IsOperation(this_00,&local_88);
    if (bVar3) {
      SWDOperation::AddFrames(&local_88,paVar1->_M_ptr);
      SWDOperation::AddMarkers(&local_88,paVar1->_M_ptr);
LAB_00106db0:
      AnalyzerResults::CommitResults();
    }
    else {
      bVar3 = SWDParser::IsLineReset(this_00,&local_a8);
      if (bVar3) {
        SWDLineReset::AddFrames(&local_a8,&paVar1->_M_ptr->super_AnalyzerResults);
        goto LAB_00106db0;
      }
      SWDParser::PopFrontBit(&local_58,this_00);
    }
    AnalyzerChannelData::GetSampleNumber();
    Analyzer::ReportProgress((ulonglong)this);
  } while( true );
}

Assistant:

void SWDAnalyzer::WorkerThread()
{
    // SetupResults();
    // get the channel pointers
    mSWDIO = GetAnalyzerChannelData( mSettings.mSWDIO );
    mSWCLK = GetAnalyzerChannelData( mSettings.mSWCLK );

    mSWDParser.Setup( mSWDIO, mSWCLK, this );

    // these are our three objects that SWDParser will fill with data
    // on calls to IsOperation or IsLineReset
    SWDOperation tran;
    SWDLineReset reset;
    SWDBit error_bit;

    mSWDParser.Clear();

    // For every new bit the parser extracts from the stream,
    // ask if this can be a valid operation or line reset.
    // A valid operation will have the constant part of the request correctly set,
    // and also the parity bits will be correct.
    // A valid line reset has at least 50 high bits in succession.
    for( ;; )
    {
        if( mSWDParser.IsOperation( tran ) )
        {
            tran.AddFrames( mResults.get() );
            tran.AddMarkers( mResults.get() );

            mResults->CommitResults();
        }
        else if( mSWDParser.IsLineReset( reset ) )
        {
            reset.AddFrames( mResults.get() );

            mResults->CommitResults();
        }
        else
        {
            // This is neither a valid transaction nor a valid reset,
            // so remove the first bit and try again.
            // We're dropping the error bit into oblivion.
            error_bit = mSWDParser.PopFrontBit();
        }

        ReportProgress( mSWDIO->GetSampleNumber() );
    }
}